

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O3

int zt_unit_run_suite(zt_unit *unit,zt_unit_suite *suite)

{
  long lVar1;
  zt_elist *pzVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  zt_unit_test *test;
  
  unit->suite_count = unit->suite_count + 1;
  printf("---\n%s:\n",suite->name);
  pcVar5 = "%*s%s:\n";
  printf("%*s%s:\n",2,"","Tests");
  for (test = (zt_unit_test *)(suite->tests).next; test != (zt_unit_test *)&suite->tests;
      test = (zt_unit_test *)(test->test).next) {
    unit->tests = unit->tests + 1;
    iVar3 = zt_unit_run_test((zt_unit *)pcVar5,suite,test);
    if (iVar3 == 1) {
      unit->successes = unit->successes + 1;
      suite->succeeded = suite->succeeded + 1;
    }
    else {
      suite->failed = suite->failed + 1;
      unit->failures = unit->failures + 1;
    }
    lVar1 = test->assertions;
    lVar4 = test->exceptions;
    if (lVar4 == 0 && lVar1 == 0) {
      suite->empty = suite->empty + 1;
      unit->empty = unit->empty + 1;
      lVar4 = 0;
    }
    iVar3 = (int)lVar1;
    suite->assertions = suite->assertions + iVar3;
    suite->exceptions = suite->exceptions + (int)lVar4;
    unit->assertions = unit->assertions + iVar3;
    unit->exceptions = unit->exceptions + (int)lVar4;
  }
  if (suite->failed != 0) {
    printf("%*s%s:\n",2,"","Errors");
    for (pzVar2 = (suite->tests).next; pzVar2 != &suite->tests; pzVar2 = pzVar2->next) {
      if (*(int *)&pzVar2[2].prev != 1) {
        iVar3 = printf("%*s%s",4,"",pzVar2[1].prev);
        pcVar5 = (char *)pzVar2[2].next;
        if ((zt_elist *)pcVar5 == (zt_elist *)0x0) {
          pcVar5 = "No Error Text";
        }
        printf("%*s: \'%s\'\n",(ulong)(0x1e - iVar3),"",pcVar5);
      }
    }
  }
  return 0;
}

Assistant:

int
zt_unit_run_suite(struct zt_unit    * unit,
                  struct zt_unit_suite     * suite)
{
    zt_elist_t          * tmp;
    struct zt_unit_test * unit_test;
    int                   result;

    unit->suite_count++;

    printf("---\n%s:\n", suite->name);
    yaml_dict("Tests", 2);

    zt_elist_for_each(&suite->tests, tmp) {
        unit->tests++;

        unit_test = zt_elist_data(tmp, struct zt_unit_test, test);
        result = zt_unit_run_test(unit, suite, unit_test);
        if (result != TRUE) {
            suite->failed += 1;
            unit->failures += 1;
        } else {
            unit->successes += 1;
            suite->succeeded += 1;
        }
        if (unit_test->assertions == 0 && unit_test->exceptions == 0) {
          suite->empty++;
          unit->empty++;
        }
        suite->assertions += unit_test->assertions;
        suite->exceptions += unit_test->exceptions;
        unit->assertions += unit_test->assertions;
        unit->exceptions += unit_test->exceptions;
    }

    if (suite->failed != 0) {
        yaml_dict("Errors", 2);
        zt_elist_for_each(&suite->tests, tmp) {
            unit_test = zt_elist_data(tmp, struct zt_unit_test, test);
            if (unit_test->success != TRUE) {
                yaml_value(unit_test->name, 4, "'%s'", unit_test->error ? unit_test->error : "No Error Text");
            }
        }
    }
    return 0;
}